

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O2

void p2sc_option_ext(int marg,int *argc,char ***argv,char *appname,char *context,char *summary,
                    GOptionEntry *entries)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *filename;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar4;
  GError *err;
  gchar *runid;
  char *local_a0;
  char *local_98;
  undefined1 local_90;
  undefined8 local_8c;
  gchar **local_80;
  char *local_78;
  char *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_80 = &runid;
  runid = (gchar *)0x0;
  err = (GError *)0x0;
  local_98 = "run-id";
  local_90 = 0x72;
  local_8c = 0x100000000;
  local_78 = "P2SC runID";
  local_70 = "runID";
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_a0 = appname;
  uVar2 = g_option_context_new(context);
  g_option_context_set_summary(uVar2,summary);
  g_option_context_add_main_entries(uVar2,&local_98,0);
  if (entries != (GOptionEntry *)0x0) {
    g_option_context_add_main_entries(uVar2,entries,0);
  }
  iVar1 = g_option_context_parse(uVar2,argc,argv,&err);
  pcVar3 = (char *)g_path_get_basename(**argv);
  if (*argc == 2) {
    filename = (char *)g_path_get_basename((*argv)[1]);
  }
  else {
    filename = (char *)0x0;
  }
  p2sc_init(pcVar3,local_a0,filename,runid);
  if ((iVar1 != 0) && (err == (GError *)0x0)) {
    if ((0 < marg) && (*argc <= marg)) {
      uVar2 = g_option_context_get_help(uVar2,1,0);
      printf("%s",uVar2);
      g_free(uVar2);
      _p2sc_msg("p2sc_option_ext",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
                ,0x90,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",4000,
                "At least %d argument(s) mandatory",CONCAT44(uVar4,marg));
      exit(1);
    }
    g_free(filename);
    g_free(pcVar3);
    g_free(runid);
    g_option_context_free(uVar2);
    return;
  }
  if ((err == (GError *)0x0) || (err->message == (gchar *)0x0)) {
    pcVar3 = "Option parsing failed: unknown reason";
    iVar1 = 0x89;
  }
  else {
    pcVar3 = "Option parsing failed: %s";
    iVar1 = 0x86;
  }
  _p2sc_msg("p2sc_option_ext",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
            ,iVar1,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",4000,pcVar3);
  exit(1);
}

Assistant:

void p2sc_option_ext(int marg, int *argc, char ***argv, const char *appname,
                     const char *context, const char *summary, const GOptionEntry *entries) {
    gboolean ret;
    gchar *runid = NULL;
    gchar *base_prog, *base_file = NULL;
    GError *err = NULL;
    GOptionEntry rentry[] = {
        { "run-id", 'r', 0, G_OPTION_ARG_STRING, &runid, "P2SC runID", "runID" },
        { NULL, 0, 0, G_OPTION_ARG_NONE, NULL, NULL, NULL }
    };
    GOptionContext *ctxt;

    ctxt = g_option_context_new(context);
    g_option_context_set_summary(ctxt, summary);
    g_option_context_add_main_entries(ctxt, rentry, NULL);
    if (entries)
        g_option_context_add_main_entries(ctxt, entries, NULL);

    ret = g_option_context_parse(ctxt, argc, argv, &err);

    base_prog = g_path_get_basename((*argv)[0]);
    if (*argc == 2)
        base_file = g_path_get_basename((*argv)[1]);

    p2sc_init(base_prog, appname, base_file, runid);

    if (!ret || err) {
        if (err && err->message) {
            P2SC_Msg(LVL_FATAL, "Option parsing failed: %s", err->message);
            g_error_free(err);
        } else
            P2SC_Msg(LVL_FATAL, "Option parsing failed: unknown reason");
    }
    if (marg > 0 && (*argc - 1) < marg) {
        char *help = g_option_context_get_help(ctxt, TRUE, NULL);
        printf("%s", help);
        g_free(help);

        P2SC_Msg(LVL_FATAL, "At least %d argument(s) mandatory", marg);
    }

    g_free(base_file);
    g_free(base_prog);
    g_free(runid);
    g_option_context_free(ctxt);
}